

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (str == (char *)0x0) {
    return -1;
  }
  xmlCleanURI(uri);
  if ((byte)((*str & 0xdfU) + 0xbf) < 0x1a) {
    lVar7 = 0;
    while (((bVar1 = str[lVar7 + 1], (byte)(bVar1 - 0x30) < 10 ||
            ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))))) {
      lVar7 = lVar7 + 1;
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->scheme != (char *)0x0) {
        (*xmlFree)(uri->scheme);
      }
      pxVar4 = xmlStrndup((xmlChar *)str,(int)lVar7 + 1);
      uri->scheme = (char *)pxVar4;
      if (pxVar4 == (xmlChar *)0x0) {
        return -1;
      }
      bVar1 = str[lVar7 + 1];
    }
    if (bVar1 == 0x3a) {
      local_50 = (byte *)(str + lVar7 + 2);
      bVar1 = *local_50;
      if (bVar1 == 0x2f) {
        if (str[lVar7 + 3] == '/') {
          local_50 = (byte *)(str + lVar7 + 4);
          iVar2 = xmlParse3986Authority(uri,(char **)&local_50);
          if (iVar2 != 0) goto LAB_0014d19b;
          if ((uri->server == (char *)0x0) && (uri->port == 0)) {
            uri->port = -1;
          }
          iVar2 = xmlParse3986PathAbEmpty(uri,(char **)&local_50);
        }
        else {
          iVar2 = xmlParse3986PathAbsolute(uri,(char **)&local_50);
        }
        pbVar6 = local_50;
        if (iVar2 != 0) {
LAB_0014d19b:
          if (iVar2 < 0) {
            return iVar2;
          }
          goto LAB_0014d1a3;
        }
      }
      else {
        local_40 = local_50;
        iVar2 = xmlIsUnreserved(uri,(char *)local_50);
        if ((iVar2 != 0) ||
           ((uVar5 = bVar1 - 0x21, uVar5 < 0x20 &&
            (((0x96000fe9U >> (uVar5 & 0x1f) & 1) != 0 ||
             (((uVar5 == 4 &&
               (((byte)(str[lVar7 + 3] - 0x30U) < 10 ||
                ((uVar5 = (byte)str[lVar7 + 3] - 0x41, uVar5 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))) &&
              (((byte)(str[lVar7 + 4] - 0x30U) < 10 ||
               ((uVar5 = (byte)str[lVar7 + 4] - 0x41, uVar5 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))))))))) {
          local_48 = local_40;
          iVar3 = xmlParse3986Segment(uri,(char **)&local_48,'\0',0);
          iVar2 = 1;
          pbVar6 = local_48;
          while (local_48 = pbVar6, iVar3 == 0) {
            if (*pbVar6 != 0x2f) {
              if (uri == (xmlURIPtr)0x0) goto LAB_0014d090;
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              if (local_40 == pbVar6) {
                uri->path = (char *)0x0;
                goto LAB_0014d090;
              }
              iVar2 = ((-2 - (int)str) + (int)pbVar6) - (int)lVar7;
              if ((uri->cleanup & 2) == 0) {
                pxVar4 = (xmlChar *)xmlURIUnescapeString((char *)local_40,iVar2,(char *)0x0);
              }
              else {
                pxVar4 = xmlStrndup(local_40,iVar2);
              }
              uri->path = (char *)pxVar4;
              if (pxVar4 != (xmlChar *)0x0) goto LAB_0014d090;
              iVar2 = -1;
              break;
            }
            local_48 = pbVar6 + 1;
            iVar3 = xmlParse3986Segment(uri,(char **)&local_48,'\0',1);
            pbVar6 = local_48;
          }
          goto LAB_0014d19b;
        }
        pbVar6 = local_40;
        if (uri != (xmlURIPtr)0x0) {
          if (uri->path != (char *)0x0) {
            (*xmlFree)(uri->path);
          }
          uri->path = (char *)0x0;
          pbVar6 = local_40;
        }
      }
LAB_0014d090:
      bVar1 = *pbVar6;
      if (bVar1 == 0x3f) {
        local_38 = pbVar6 + 1;
        iVar2 = xmlParse3986Query(uri,(char **)&local_38);
        if (iVar2 != 0) {
          return -1;
        }
        bVar1 = *local_38;
        pbVar6 = local_38;
      }
      if (bVar1 == 0x23) {
        local_38 = pbVar6 + 1;
        iVar2 = xmlParse3986Fragment(uri,(char **)&local_38);
        if (iVar2 != 0) {
          return -1;
        }
        bVar1 = *local_38;
      }
      if (bVar1 == 0) {
        return 0;
      }
      xmlCleanURI(uri);
    }
  }
LAB_0014d1a3:
  xmlCleanURI(uri);
  bVar1 = *str;
  local_50 = (byte *)str;
  if (bVar1 == 0x2f) {
    if (str[1] == '/') {
      local_50 = (byte *)(str + 2);
      iVar2 = xmlParse3986Authority(uri,(char **)&local_50);
      if (iVar2 != 0) goto LAB_0014d389;
      iVar2 = xmlParse3986PathAbEmpty(uri,(char **)&local_50);
    }
    else {
      iVar2 = xmlParse3986PathAbsolute(uri,(char **)&local_50);
    }
    if (iVar2 != 0) goto LAB_0014d389;
LAB_0014d340:
    bVar1 = *local_50;
    if (bVar1 == 0x3f) {
      local_50 = local_50 + 1;
      iVar2 = xmlParse3986Query(uri,(char **)&local_50);
      if (iVar2 == 0) {
        bVar1 = *local_50;
        goto LAB_0014d36a;
      }
LAB_0014d386:
      iVar2 = -1;
      goto LAB_0014d389;
    }
LAB_0014d36a:
    if (bVar1 == 0x23) {
      local_50 = local_50 + 1;
      iVar2 = xmlParse3986Fragment(uri,(char **)&local_50);
      if (iVar2 != 0) goto LAB_0014d386;
      bVar1 = *local_50;
    }
    if (bVar1 == 0) {
      return 0;
    }
    xmlCleanURI(uri);
  }
  else {
    iVar2 = xmlIsUnreserved(uri,str);
    if ((iVar2 == 0) &&
       ((uVar5 = bVar1 - 0x21, 0x1f < uVar5 ||
        (((0x96000fe9U >> (uVar5 & 0x1f) & 1) == 0 &&
         (((uVar5 != 4 ||
           ((9 < (byte)(str[1] - 0x30U) &&
            ((uVar5 = (byte)str[1] - 0x41, 0x25 < uVar5 ||
             ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))) ||
          ((9 < (byte)(str[2] - 0x30U) &&
           ((uVar5 = (byte)str[2] - 0x41, 0x25 < uVar5 ||
            ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))))))))) {
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
        }
        uri->path = (char *)0x0;
      }
      goto LAB_0014d340;
    }
    local_48 = (byte *)str;
    iVar2 = xmlParse3986Segment(uri,(char **)&local_48,':',0);
    if (iVar2 == 0) {
      iVar2 = 1;
      do {
        pbVar6 = local_48;
        if (*local_48 != 0x2f) {
          if (uri != (xmlURIPtr)0x0) {
            if (uri->path != (char *)0x0) {
              (*xmlFree)(uri->path);
            }
            if (pbVar6 == (byte *)str) {
              uri->path = (char *)0x0;
            }
            else {
              iVar2 = (int)pbVar6 - (int)str;
              if ((uri->cleanup & 2) == 0) {
                pxVar4 = (xmlChar *)xmlURIUnescapeString(str,iVar2,(char *)0x0);
              }
              else {
                pxVar4 = xmlStrndup((xmlChar *)str,iVar2);
              }
              uri->path = (char *)pxVar4;
              if (pxVar4 == (xmlChar *)0x0) goto LAB_0014d386;
            }
          }
          local_50 = pbVar6;
          goto LAB_0014d340;
        }
        local_48 = local_48 + 1;
        iVar3 = xmlParse3986Segment(uri,(char **)&local_48,'\0',1);
      } while (iVar3 == 0);
      goto LAB_0014d389;
    }
  }
  iVar2 = 1;
LAB_0014d389:
  xmlCleanURI(uri);
  return iVar2;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret < 0)
        return(ret);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}